

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
          *handler)

{
  internal *__last;
  bool bVar1;
  internal iVar2;
  internal *piVar3;
  void *pvVar4;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar5;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
  *this_00;
  char *message;
  internal *piVar6;
  internal *end;
  internal *local_70;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
             *)format_str.size_;
  end = (internal *)(format_str.data_ + (long)this);
  do {
    if (this == end) {
      return;
    }
    piVar3 = this;
    if ((*this == (internal)0x7b) ||
       (piVar3 = (internal *)memchr(this,0x7b,(long)end - (long)this), piVar6 = this,
       piVar3 != (internal *)0x0)) {
      piVar6 = this;
      if (this != piVar3) {
        do {
          pvVar4 = memchr(piVar6,0x7d,(long)piVar3 - (long)piVar6);
          if (pvVar4 == (void *)0x0) {
            bVar5.container =
                 (this_00->context).
                 super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
                 .out_.container;
            if (piVar6 != piVar3) {
              bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                      __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                                ((char *)piVar6,(char *)(piVar6 + ((long)piVar3 - (long)piVar6)),
                                 bVar5);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
            .out_.container = bVar5.container;
LAB_001d7541:
            bVar1 = false;
          }
          else {
            __last = (internal *)((long)pvVar4 + 1);
            if ((__last == piVar3) || (*__last != (internal)0x7d)) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
              goto LAB_001d7541;
            }
            bVar5.container =
                 (this_00->context).
                 super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
                 .out_.container;
            if (__last != piVar6) {
              bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                      __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                                ((char *)piVar6,(char *)__last,bVar5);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
            .out_.container = bVar5.container;
            piVar6 = (internal *)((long)pvVar4 + 2);
            bVar1 = true;
          }
        } while (bVar1);
      }
      local_70 = piVar3 + 1;
      if (local_70 == end) {
        message = "invalid format string";
        goto LAB_001d759d;
      }
      if (*local_70 == (internal)0x7b) {
        bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                          ((char *)local_70,(char *)(piVar3 + 2),
                           (this_00->context).
                           super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
                           .out_.container);
        (this_00->context).
        super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
        .out_.container = bVar5.container;
      }
      else {
        if (*local_70 != (internal)0x7d) {
          local_58._0_8_ = this_00;
          local_70 = (internal *)
                     parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>&,char>>
                               ((char *)local_70,(char *)end,
                                (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>_&,_char>
                                 *)&local_58.string);
          if (local_70 == end) {
            iVar2 = (internal)0x0;
          }
          else {
            iVar2 = *local_70;
          }
          if (iVar2 == (internal)0x3a) {
            local_70 = (internal *)
                       format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
                       ::on_format_specs(this_00,(char *)(local_70 + 1),(char *)end);
            if ((local_70 != end) && (*local_70 == (internal)0x7d)) goto LAB_001d768a;
            message = "unknown format specifier";
          }
          else {
            if (iVar2 == (internal)0x7d) goto LAB_001d767f;
            message = "missing \'}\' in format string";
          }
LAB_001d759d:
          error_handler::on_error((error_handler *)this_00,message);
          goto LAB_001d7632;
        }
        basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>
        ::next_arg((format_arg *)&local_58.string,&this_00->context);
        (this_00->arg).type_ = local_48;
        (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
        (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_001d767f:
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
        ::on_replacement_field(this_00,(char *)local_70);
      }
LAB_001d768a:
      local_70 = local_70 + 1;
      bVar1 = true;
    }
    else {
      do {
        pvVar4 = memchr(piVar6,0x7d,(long)end - (long)piVar6);
        if (pvVar4 == (void *)0x0) {
          bVar5.container =
               (this_00->context).
               super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
               .out_.container;
          if (piVar6 != end) {
            bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                    __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                              ((char *)piVar6,(char *)(piVar6 + ((long)end - (long)piVar6)),bVar5);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
          .out_.container = bVar5.container;
LAB_001d7628:
          bVar1 = false;
        }
        else {
          piVar3 = (internal *)((long)pvVar4 + 1);
          if ((piVar3 == end) || (*piVar3 != (internal)0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_001d7628;
          }
          bVar5.container =
               (this_00->context).
               super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
               .out_.container;
          if (piVar3 != piVar6) {
            bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                    __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                              ((char *)piVar6,(char *)piVar3,bVar5);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_char>
          .out_.container = bVar5.container;
          piVar6 = (internal *)((long)pvVar4 + 2);
          bVar1 = true;
        }
      } while (bVar1);
LAB_001d7632:
      bVar1 = false;
      local_70 = this;
    }
    this = local_70;
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}